

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O1

optional_idx __thiscall
duckdb::GroupedAggregateHashTable::TryAddDictionaryGroups
          (GroupedAggregateHashTable *this,DataChunk *groups,DataChunk *payload,
          unsafe_vector<idx_t> *filter)

{
  buffer_ptr<VectorBuffer> *this_00;
  shared_ptr<duckdb::TupleDataLayout,_true> *this_01;
  AggregateDictionaryState *pAVar1;
  SelectionVector *sel;
  DataChunk *this_02;
  size_t __n;
  _Head_base<0UL,_duckdb::Vector_*,_false> __ptr;
  _Head_base<0UL,_bool_*,_false> _Var2;
  _func_int **pp_Var3;
  sel_t *psVar4;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  long lVar7;
  pointer pcVar8;
  _Head_base<0UL,_duckdb::Vector_*,_false> _Var9;
  int iVar10;
  reference pvVar11;
  VectorBuffer *pVVar12;
  idx_t iVar13;
  VectorBuffer *pVVar14;
  Vector *pVVar15;
  _Head_base<0UL,_bool_*,_false> __s;
  idx_t iVar16;
  TupleDataLayout *pTVar17;
  type pVVar18;
  InternalException *this_03;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  idx_t iVar22;
  optional_idx opt_dict_size;
  optional_idx local_b8;
  DataChunk *local_b0;
  _Head_base<0UL,_duckdb::Vector_*,_false> local_a8;
  VectorBuffer *local_a0;
  undefined1 local_98 [32];
  idx_t local_78;
  unsafe_vector<idx_t> *local_70;
  GroupedAggregateHashTable *local_68;
  DataChunk *local_60;
  optional_idx local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&groups->data,0);
  DictionaryVector::VerifyDictionary(pvVar11);
  this_00 = &pvVar11->buffer;
  pVVar12 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(this_00);
  local_58.index = (idx_t)pVVar12[1].data.allocator.ptr;
  if ((Allocator *)local_58.index != (Allocator *)0xffffffffffffffff) {
    local_b0 = groups;
    local_60 = payload;
    iVar13 = optional_idx::GetIndex(&local_58);
    DictionaryVector::VerifyDictionary(pvVar11);
    pVVar12 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(this_00);
    if (pVVar12[1].data.allocated_size == 0) {
      if (iVar13 * 2 < local_b0->count) goto LAB_015e12ec;
    }
    else if (iVar13 < 20000) {
LAB_015e12ec:
      DictionaryVector::VerifyDictionary(pvVar11);
      pVVar14 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar11->auxiliary);
      DictionaryVector::VerifyDictionary(pvVar11);
      local_a0 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(this_00);
      pAVar1 = &(this->state).dict_state;
      __n = (this->state).dict_state.dictionary_id._M_string_length;
      if (((__n == 0) || (__n != pVVar12[1].data.allocated_size)) ||
         (iVar10 = bcmp((pAVar1->dictionary_id)._M_dataplus._M_p,pVVar12[1].data.pointer,__n),
         iVar10 != 0)) {
        if ((this->state).dict_state.capacity < iVar13) {
          pVVar15 = (Vector *)operator_new(0x68);
          LogicalType::LogicalType((LogicalType *)local_98,POINTER);
          Vector::Vector(pVVar15,(LogicalType *)local_98,iVar13);
          local_a8._M_head_impl = pVVar15;
          LogicalType::~LogicalType((LogicalType *)local_98);
          _Var9._M_head_impl = local_a8._M_head_impl;
          local_a8._M_head_impl = (Vector *)0x0;
          __ptr._M_head_impl =
               (this->state).dict_state.dictionary_addresses.
               super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
               super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
               super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
               super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
          (this->state).dict_state.dictionary_addresses.
          super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
          super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
          super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = _Var9._M_head_impl;
          if (__ptr._M_head_impl != (Vector *)0x0) {
            ::std::default_delete<duckdb::Vector>::operator()
                      ((default_delete<duckdb::Vector> *)
                       &(this->state).dict_state.dictionary_addresses,__ptr._M_head_impl);
          }
          if (local_a8._M_head_impl != (Vector *)0x0) {
            ::std::default_delete<duckdb::Vector>::operator()
                      ((default_delete<duckdb::Vector> *)&local_a8,local_a8._M_head_impl);
          }
          __s._M_head_impl = (bool *)operator_new__(iVar13);
          switchD_01306cb1::default(__s._M_head_impl,0,iVar13);
          _Var2._M_head_impl =
               (this->state).dict_state.found_entry.
               super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
               super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
               super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
               super__Head_base<0UL,_bool_*,_false>._M_head_impl;
          (this->state).dict_state.found_entry.
          super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
          super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
          super__Head_base<0UL,_bool_*,_false>._M_head_impl = __s._M_head_impl;
          if (_Var2._M_head_impl != (bool *)0x0) {
            operator_delete__(_Var2._M_head_impl);
          }
          (this->state).dict_state.capacity = iVar13;
        }
        switchD_01306cb1::default
                  ((this->state).dict_state.found_entry.
                   super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
                   super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                   super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                   super__Head_base<0UL,_bool_*,_false>._M_head_impl,0,iVar13);
        ::std::__cxx11::string::_M_assign((string *)pAVar1);
      }
      else if ((this->state).dict_state.capacity < iVar13) {
        this_03 = (InternalException *)__cxa_allocate_exception(0x10);
        local_98._0_8_ = local_98 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_98,
                   "AggregateHT - using cached dictionary data but dictionary has changed (dictionary id %s - dict size %d, current capacity %d)"
                   ,"");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar8 = (this->state).dict_state.dictionary_id._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar8,
                   pcVar8 + (this->state).dict_state.dictionary_id._M_string_length);
        InternalException::InternalException<std::__cxx11::string,unsigned_long,unsigned_long>
                  (this_03,(string *)local_98,&local_50,iVar13,(this->state).dict_state.capacity);
        __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar20 = local_b0->count;
      if (uVar20 == 0) {
        iVar13 = 0;
      }
      else {
        pp_Var3 = local_a0[1]._vptr_VectorBuffer;
        psVar4 = (this->state).dict_state.unique_entries.sel_vector;
        _Var2._M_head_impl =
             (this->state).dict_state.found_entry.
             super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
             super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
             super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
             super__Head_base<0UL,_bool_*,_false>._M_head_impl;
        iVar13 = 0;
        uVar19 = 0;
        do {
          uVar21 = uVar19;
          if (pp_Var3 != (_func_int **)0x0) {
            uVar21 = (ulong)*(uint *)((long)pp_Var3 + uVar19 * 4);
          }
          psVar4[iVar13] = (sel_t)uVar21;
          iVar13 = ((ulong)_Var2._M_head_impl[uVar21] ^ 1) + iVar13;
          _Var2._M_head_impl[uVar21] = true;
          uVar19 = uVar19 + 1;
        } while (uVar20 != uVar19);
      }
      sel = &(this->state).dict_state.unique_entries;
      if (iVar13 == 0) {
        iVar16 = 0;
      }
      else {
        this_02 = &(this->state).dict_state.unique_values;
        if (*(pointer *)
             ((long)&(this->state).dict_state.unique_values.data.
                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl + 8
             ) == (this->state).dict_state.unique_values.data.
                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start) {
          DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)local_98,local_b0);
          DataChunk::InitializeEmpty(this_02,(vector<duckdb::LogicalType,_true> *)local_98);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_98);
        }
        pvVar11 = vector<duckdb::Vector,_true>::operator[](&this_02->data,0);
        Vector::Slice(pvVar11,(Vector *)(pVVar14 + 1),sel,iVar13);
        (this->state).dict_state.unique_values.count = iVar13;
        pVVar15 = &(this->state).dict_state.hashes;
        DataChunk::Hash(this_02,pVVar15);
        iVar16 = FindOrCreateGroupsInternal
                           (this,this_02,pVVar15,&(this->state).dict_state.new_dictionary_pointers,
                            &(this->state).new_groups);
      }
      this_01 = &(this->super_BaseAggregateHashTable).layout_ptr;
      pTVar17 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(this_01);
      if ((pTVar17->aggregates).
          super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
          super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pTVar17->aggregates).
          super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
          super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pdVar5 = (this->state).dict_state.new_dictionary_pointers.data;
        local_78 = iVar16;
        local_70 = filter;
        local_68 = this;
        pVVar18 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (&(this->state).dict_state.dictionary_addresses);
        pdVar6 = pVVar18->data;
        if (iVar13 != 0) {
          iVar16 = 0;
          do {
            psVar4 = sel->sel_vector;
            iVar22 = iVar16;
            if (psVar4 != (sel_t *)0x0) {
              iVar22 = (idx_t)psVar4[iVar16];
            }
            lVar7 = *(long *)(pdVar5 + iVar16 * 8);
            pTVar17 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(this_01);
            *(idx_t *)(pdVar6 + iVar22 * 8) = lVar7 + pTVar17->flag_width + pTVar17->data_width;
            iVar16 = iVar16 + 1;
          } while (iVar13 != iVar16);
        }
        iVar16 = local_78;
        if (local_b0->count != 0) {
          pdVar5 = (local_68->state).addresses.data;
          pp_Var3 = local_a0[1]._vptr_VectorBuffer;
          uVar20 = 0;
          do {
            uVar19 = uVar20;
            if (pp_Var3 != (_func_int **)0x0) {
              uVar19 = (ulong)*(uint *)((long)pp_Var3 + uVar20 * 4);
            }
            *(undefined8 *)(pdVar5 + uVar20 * 8) = *(undefined8 *)(pdVar6 + uVar19 * 8);
            uVar20 = uVar20 + 1;
          } while (uVar20 < local_b0->count);
        }
        UpdateAggregates(local_68,local_60,local_70);
      }
      optional_idx::optional_idx(&local_b8,iVar16);
      return (optional_idx)local_b8.index;
    }
  }
  return (optional_idx)0xffffffffffffffff;
}

Assistant:

optional_idx GroupedAggregateHashTable::TryAddDictionaryGroups(DataChunk &groups, DataChunk &payload,
                                                               const unsafe_vector<idx_t> &filter) {
	static constexpr idx_t MAX_DICTIONARY_SIZE_THRESHOLD = 20000;
	static constexpr idx_t DICTIONARY_THRESHOLD = 2;
	// dictionary vector - check if this is a duplicate eliminated dictionary from the storage
	auto &dict_col = groups.data[0];
	auto opt_dict_size = DictionaryVector::DictionarySize(dict_col);
	if (!opt_dict_size.IsValid()) {
		// dict size not known - this is not a dictionary that comes from the storage
		return optional_idx();
	}
	idx_t dict_size = opt_dict_size.GetIndex();
	auto &dictionary_id = DictionaryVector::DictionaryId(dict_col);
	if (dictionary_id.empty()) {
		// dictionary has no id, we can't cache across vectors
		// only use dictionary compression if there are fewer entries than groups
		if (dict_size * DICTIONARY_THRESHOLD >= groups.size()) {
			// dictionary is too large - use regular aggregation
			return optional_idx();
		}
	} else {
		// dictionary has an id - we can cache across vectors
		// use a much larger limit for dictionary
		if (dict_size >= MAX_DICTIONARY_SIZE_THRESHOLD) {
			// dictionary is too large - use regular aggregation
			return optional_idx();
		}
	}
	auto &dictionary_vector = DictionaryVector::Child(dict_col);
	auto &offsets = DictionaryVector::SelVector(dict_col);
	auto &dict_state = state.dict_state;
	if (dict_state.dictionary_id.empty() || dict_state.dictionary_id != dictionary_id) {
		// new dictionary - initialize the index state
		if (dict_size > dict_state.capacity) {
			dict_state.dictionary_addresses = make_uniq<Vector>(LogicalType::POINTER, dict_size);
			dict_state.found_entry = make_unsafe_uniq_array<bool>(dict_size);
			dict_state.capacity = dict_size;
		}
		memset(dict_state.found_entry.get(), 0, dict_size * sizeof(bool));
		dict_state.dictionary_id = dictionary_id;
	} else if (dict_size > dict_state.capacity) {
		throw InternalException("AggregateHT - using cached dictionary data but dictionary has changed (dictionary id "
		                        "%s - dict size %d, current capacity %d)",
		                        dict_state.dictionary_id, dict_size, dict_state.capacity);
	}

	auto &found_entry = dict_state.found_entry;
	auto &unique_entries = dict_state.unique_entries;
	idx_t unique_count = 0;
	// for each of the dictionary entries - check if we have already done a look-up into the hash table
	// if we have, we can just use the cached group pointers
	for (idx_t i = 0; i < groups.size(); i++) {
		auto dict_idx = offsets.get_index(i);
		unique_entries.set_index(unique_count, dict_idx);
		unique_count += !found_entry[dict_idx];
		found_entry[dict_idx] = true;
	}
	auto &new_dictionary_pointers = dict_state.new_dictionary_pointers;
	idx_t new_group_count = 0;
	if (unique_count > 0) {
		auto &unique_values = dict_state.unique_values;
		if (unique_values.ColumnCount() == 0) {
			unique_values.InitializeEmpty(groups.GetTypes());
		}
		// slice the dictionary
		unique_values.data[0].Slice(dictionary_vector, unique_entries, unique_count);
		unique_values.SetCardinality(unique_count);
		// now we know which entries we are going to add - hash them
		auto &hashes = dict_state.hashes;
		unique_values.Hash(hashes);

		// add the dictionary groups to the hash table
		new_group_count = FindOrCreateGroups(unique_values, hashes, new_dictionary_pointers, state.new_groups);
	}
	auto &aggregates = layout_ptr->GetAggregates();
	if (aggregates.empty()) {
		// early-out - no aggregates to update
		return new_group_count;
	}

	// set the addresses that we found for each of the unique groups in the main addresses vector
	auto new_dict_addresses = FlatVector::GetData<uintptr_t>(new_dictionary_pointers);
	// for each of the new groups, add them to the global (cached) list of addresses for the dictionary
	auto &dictionary_addresses = *dict_state.dictionary_addresses;
	auto dict_addresses = FlatVector::GetData<uintptr_t>(dictionary_addresses);
	for (idx_t i = 0; i < unique_count; i++) {
		auto dict_idx = unique_entries.get_index(i);
		dict_addresses[dict_idx] = new_dict_addresses[i] + layout_ptr->GetAggrOffset();
	}
	// now set up the addresses for the aggregates
	auto result_addresses = FlatVector::GetData<uintptr_t>(state.addresses);
	for (idx_t i = 0; i < groups.size(); i++) {
		auto dict_idx = offsets.get_index(i);
		result_addresses[i] = dict_addresses[dict_idx];
	}

	// finally process the aggregates
	UpdateAggregates(payload, filter);

	return new_group_count;
}